

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::ExtensionSet::ShouldRegisterAtThisTime
          (ExtensionSet *this,
          initializer_list<google::protobuf::internal::ExtensionSet::WeakPrototypeRef> messages,
          bool is_preregistration)

{
  const_iterator pWVar1;
  Message *pMVar2;
  bool bVar3;
  bool bVar4;
  WeakPrototypeRef ref;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<google::protobuf::internal::ExtensionSet::WeakPrototypeRef> *__range2;
  undefined1 auStack_18 [6];
  bool has_all;
  bool is_preregistration_local;
  initializer_list<google::protobuf::internal::ExtensionSet::WeakPrototypeRef> messages_local;
  
  messages_local._M_array = messages._M_array;
  bVar4 = true;
  _auStack_18 = this;
  __end2 = std::initializer_list<google::protobuf::internal::ExtensionSet::WeakPrototypeRef>::begin
                     ((initializer_list<google::protobuf::internal::ExtensionSet::WeakPrototypeRef>
                       *)auStack_18);
  pWVar1 = std::initializer_list<google::protobuf::internal::ExtensionSet::WeakPrototypeRef>::end
                     ((initializer_list<google::protobuf::internal::ExtensionSet::WeakPrototypeRef>
                       *)auStack_18);
  for (; __end2 != pWVar1; __end2 = __end2 + 1) {
    bVar3 = bVar4 != false;
    bVar4 = false;
    if (bVar3) {
      ref.table._0_4_ = (int)*(undefined8 *)&__end2->index;
      pMVar2 = GetPrototypeForWeakDescriptor(__end2->table,(int)ref.table,false);
      bVar4 = pMVar2 != (Message *)0x0;
    }
  }
  return bVar4 == (bool)((byte)messages._M_len & 1);
}

Assistant:

bool ExtensionSet::ShouldRegisterAtThisTime(
    std::initializer_list<WeakPrototypeRef> messages, bool is_preregistration) {
  bool has_all = true;
  for (auto ref : messages) {
    has_all = has_all && GetPrototypeForWeakDescriptor(ref.table, ref.index,
                                                       false) != nullptr;
  }
  return has_all == is_preregistration;
}